

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qedidparser.cpp
# Opt level: O3

QString * __thiscall
QEdidParser::parseEdidString(QString *__return_storage_ptr__,QEdidParser *this,quint8 *data)

{
  char cVar1;
  storage_type *psVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(&local_38,(char *)data,0xd);
  if ((storage_type *)local_38.d.size == (storage_type *)0x0) {
    psVar2 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0x0;
    do {
      if ((&(local_38.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData((longlong)&local_38,(AllocationOption)local_38.d.size);
      }
      cVar1 = local_38.d.ptr[(long)psVar3];
      if (cVar1 == '\n') {
        QByteArray::truncate((longlong)&local_38);
        psVar2 = (storage_type *)local_38.d.size;
        break;
      }
      if ((&(local_38.d.d)->super_QArrayData == (QArrayData *)0x0) ||
         (1 < ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QByteArray::reallocData((longlong)&local_38,(AllocationOption)local_38.d.size);
        cVar1 = local_38.d.ptr[(long)psVar3];
      }
      if (cVar1 < ' ') {
LAB_006730c6:
        if ((&(local_38.d.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData((longlong)&local_38,(AllocationOption)local_38.d.size);
        }
        local_38.d.ptr[(long)psVar3] = '-';
      }
      else {
        if ((&(local_38.d.d)->super_QArrayData == (QArrayData *)0x0) ||
           (1 < ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QByteArray::reallocData((longlong)&local_38,(AllocationOption)local_38.d.size);
          cVar1 = local_38.d.ptr[(long)psVar3];
        }
        if (cVar1 == '\x7f') goto LAB_006730c6;
      }
      psVar3 = psVar3 + 1;
      psVar2 = (storage_type *)local_38.d.size;
    } while (psVar3 < (ulong)local_38.d.size);
  }
  QVar4.m_data = psVar2;
  QVar4.m_size = (qsizetype)__return_storage_ptr__;
  QString::fromLatin1(QVar4);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QEdidParser::parseEdidString(const quint8 *data)
{
    QByteArray buffer(reinterpret_cast<const char *>(data), 13);

    for (int i = 0; i < buffer.size(); ++i) {
        // If there are less than 13 characters in the string, the string
        // is terminated with the ASCII code ‘0Ah’ (line feed) and padded
        // with ASCII code ‘20h’ (space). See EDID 1.4, sections 3.10.3.1,
        // 3.10.3.2, and 3.10.3.4.
        if (buffer[i] == '\n') {
            buffer.truncate(i);
            break;
        }

        // Replace non-printable characters with dash
        if (buffer[i] < '\040' || buffer[i] > '\176')
            buffer[i] = '-';
    }

    return QString::fromLatin1(buffer);
}